

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderCreateShaderProgramvTest::iterate(GeometryShaderCreateShaderProgramvTest *this)

{
  GLuint *pGVar1;
  ostringstream *poVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  long lVar7;
  qpTestResult testResult;
  long lVar8;
  undefined1 *puVar9;
  TestContext **ppTVar10;
  GLint link_status;
  GLuint so_po_ids [3];
  char *vs_specialized_code_raw;
  char *gs_specialized_code_raw;
  char *fs_specialized_code_raw;
  string vs_specialized_code;
  string gs_specialized_code;
  string fs_specialized_code;
  uchar result_data [64];
  int local_28c;
  GeometryShaderCreateShaderProgramvTest *local_288;
  GLuint local_27c [3];
  pointer local_270;
  pointer local_268;
  pointer local_260;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [120];
  ios_base local_180 [264];
  undefined1 local_78 [3];
  undefined1 local_75 [69];
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar4);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0x109);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initFBO(this);
  TestCaseBase::specializeShader_abi_cxx11_(&local_218,&this->super_TestCaseBase,1,&fs_code);
  local_260 = local_218._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_(&local_238,&this->super_TestCaseBase,1,&gs_code);
  local_268 = local_238._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_(&local_258,&this->super_TestCaseBase,1,&vs_code);
  local_270 = local_258._M_dataplus._M_p;
  local_28c = 1;
  GVar5 = (**(code **)(lVar8 + 0x3f8))(0x8dd9,1,&gs_code);
  this->m_gs_po_id = GVar5;
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glCreateShaderProgramv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0x120);
  if (this->m_gs_po_id == 0) {
    local_1f8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1f8 + 8),"glCreateShaderProgramv() call returned 0.",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ceedae:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f8 + 8));
    std::ios_base::~ios_base(local_180);
  }
  else {
    (**(code **)(lVar8 + 0x9d8))(this->m_gs_po_id,0x8b82,&local_28c);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,300);
    if (local_28c != 0) {
      local_1f8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1f8 + 8),"An invalid shader program was linked successfully.",
                 0x32);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00ceedae;
    }
    (**(code **)(lVar8 + 0x448))(this->m_gs_po_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glDeleteProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x138);
    GVar5 = (**(code **)(lVar8 + 0x3f8))(0x8b30,1,&local_260);
    this->m_fs_po_id = GVar5;
    GVar5 = (**(code **)(lVar8 + 0x3f8))(0x8dd9,1,&local_268);
    this->m_gs_po_id = GVar5;
    GVar5 = (**(code **)(lVar8 + 0x3f8))(0x8b31,1,&local_270);
    this->m_vs_po_id = GVar5;
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glCreateShaderProgramv() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x142);
    if (this->m_vs_po_id == 0 || (this->m_gs_po_id == 0 || this->m_fs_po_id == 0)) {
      local_1f8._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1f8 + 8),"At least one glCreateShaderProgramv() call returned 0."
                 ,0x36);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00ceedae;
    }
    local_27c[0] = this->m_fs_po_id;
    local_27c[1] = this->m_gs_po_id;
    local_27c[2] = this->m_vs_po_id;
    lVar7 = 0;
    local_288 = this;
    do {
      (**(code **)(lVar8 + 0x9d8))(local_27c[lVar7],0x8b82,&local_28c);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"glGetProgramiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0x155);
      this = local_288;
      if (local_28c != 1) {
        local_1f8._0_8_ =
             ((local_288->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1f8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"A valid shader program with id [",0x20);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"] was not linked successfully.",0x1e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ceedae;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    pGVar1 = &local_288->m_vao_id;
    (**(code **)(lVar8 + 0x708))(1,pGVar1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGenVertexArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x163);
    (**(code **)(lVar8 + 0xd8))(*pGVar1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindVertexArray() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x166);
    initPipelineObject(this);
    (**(code **)(lVar8 + 0x98))(this->m_pipeline_object_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindProgramPipeline() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x16d);
    (**(code **)(lVar8 + 0x538))(0,0,1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x171);
    (**(code **)(lVar8 + 0x1220))(0,0,4,4,0x1908,0x1401,local_78);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x179);
    ppTVar10 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    poVar2 = (ostringstream *)(local_1f8 + 8);
    bVar3 = true;
    puVar9 = local_75;
    lVar8 = 0;
    do {
      lVar7 = 0;
      do {
        if ((((puVar9[lVar7 * 4 + -3] != '\0') || (puVar9[lVar7 * 4 + -2] != -1)) ||
            (puVar9[lVar7 * 4 + -1] != '\0')) || (puVar9[lVar7 * 4] != '\0')) {
          local_1f8._0_8_ = (*ppTVar10)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"Invalid result texel found at (",0x1f);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,").",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_180);
          bVar3 = false;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      lVar8 = lVar8 + 1;
      puVar9 = puVar9 + 4;
    } while (lVar8 != 4);
    this = local_288;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00ceeddd;
    }
  }
  ppTVar10 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00ceeddd:
  tcu::TestContext::setTestResult(*ppTVar10,testResult,description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderCreateShaderProgramvTest::iterate()
{
	const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
	const unsigned int	n_so_po_ids = 3;
	bool				  result	  = true;
	glw::GLuint			  so_po_ids[n_so_po_ids];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize off-screen rendering */
	initFBO();

	/* Form shader sources */
	std::string fs_specialized_code = specializeShader(1,
													   /* parts */ &fs_code);
	const char* fs_specialized_code_raw = fs_specialized_code.c_str();
	std::string gs_specialized_code		= specializeShader(1,
													   /* parts */ &gs_code);
	const char* gs_specialized_code_raw = gs_specialized_code.c_str();
	std::string vs_specialized_code		= specializeShader(1,
													   /* parts */ &vs_code);
	const char* vs_specialized_code_raw = vs_specialized_code.c_str();

	/* Try to create an invalid geometry shader program first */
	glw::GLint link_status = GL_TRUE;

	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &gs_code);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call failed.");

	if (m_gs_po_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glCreateShaderProgramv() call returned 0."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.getProgramiv(m_gs_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_FALSE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "An invalid shader program was linked successfully."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	gl.deleteProgram(m_gs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed.");

	/* Create shader programs */
	m_fs_po_id = gl.createShaderProgramv(GL_FRAGMENT_SHADER, 1, /* count */
										 &fs_specialized_code_raw);
	m_gs_po_id = gl.createShaderProgramv(GL_GEOMETRY_SHADER, 1, /* count */
										 &gs_specialized_code_raw);
	m_vs_po_id = gl.createShaderProgramv(GL_VERTEX_SHADER, 1, /* count */
										 &vs_specialized_code_raw);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShaderProgramv() call(s) failed.");

	if (m_fs_po_id == 0 || m_gs_po_id == 0 || m_vs_po_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "At least one glCreateShaderProgramv() call returned 0."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Make sure all shader programs were linked successfully */
	so_po_ids[0] = m_fs_po_id;
	so_po_ids[1] = m_gs_po_id;
	so_po_ids[2] = m_vs_po_id;

	for (unsigned int n_po_id = 0; n_po_id != n_so_po_ids; ++n_po_id)
	{
		gl.getProgramiv(so_po_ids[n_po_id], GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

		if (link_status != GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "A valid shader program with id [" << so_po_ids[n_po_id]
							   << "] was not linked successfully." << tcu::TestLog::EndMessage;

			result = false;
			goto end;
		}
	}

	/* Set up the vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Set up the pipeline object */
	initPipelineObject();

	/* Render a full-screen quad */
	gl.bindProgramPipeline(m_pipeline_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() call failed.");

	gl.drawArrays(GL_POINTS, 0, /* first */
				  1);			/* count */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

	/* Verify the rendering result */
	unsigned char result_data[m_to_width * m_to_height * 4 /* rgba */];

	gl.readPixels(0, /* x */
				  0, /* y */
				  m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		unsigned char* traveller_ptr = result_data + 4 * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			if (traveller_ptr[0] != 0 || traveller_ptr[1] != 255 || traveller_ptr[2] != 0 || traveller_ptr[3] != 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid result texel found at (" << x << ", " << y
								   << ")." << tcu::TestLog::EndMessage;

				result = false;
			}

			traveller_ptr += 4; /* rgba */
		}
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}